

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Server.cpp
# Opt level: O0

void __thiscall RenX::Server::setUUIDFunction(Server *this,uuid_func func)

{
  uuid_func p_Var1;
  bool bVar2;
  reference player;
  reference pPVar3;
  string local_58;
  __sv_type local_38;
  _Self local_28;
  _Self local_20;
  iterator node;
  uuid_func func_local;
  Server *this_local;
  
  this->m_calc_uuid = func;
  node._M_node = (_List_node_base *)func;
  local_20._M_node =
       (_List_node_base *)
       std::__cxx11::list<RenX::PlayerInfo,_std::allocator<RenX::PlayerInfo>_>::begin
                 (&this->players);
  while( true ) {
    local_28._M_node =
         (_List_node_base *)
         std::__cxx11::list<RenX::PlayerInfo,_std::allocator<RenX::PlayerInfo>_>::end
                   (&this->players);
    bVar2 = std::operator==(&local_20,&local_28);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    player = std::_List_iterator<RenX::PlayerInfo>::operator*(&local_20);
    p_Var1 = this->m_calc_uuid;
    pPVar3 = std::_List_iterator<RenX::PlayerInfo>::operator*(&local_20);
    (*p_Var1)(&local_58,pPVar3);
    local_38 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_58);
    setUUIDIfDifferent(this,player,local_38);
    std::__cxx11::string::~string((string *)&local_58);
    std::_List_iterator<RenX::PlayerInfo>::operator++(&local_20);
  }
  return;
}

Assistant:

void RenX::Server::setUUIDFunction(RenX::Server::uuid_func func) {
	m_calc_uuid = func;

	for (auto node = this->players.begin(); node != this->players.end(); ++node) {
		setUUIDIfDifferent(*node, m_calc_uuid(*node));
	}
}